

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cJSON.c
# Opt level: O0

cJSON * create_reference(cJSON *item,internal_hooks *hooks)

{
  cJSON *ref;
  internal_hooks *hooks_local;
  cJSON *item_local;
  
  item_local = cJSON_New_Item(hooks);
  if (item_local == (cJSON *)0x0) {
    item_local = (cJSON *)0x0;
  }
  else {
    memcpy(item_local,item,0x40);
    item_local->string = (char *)0x0;
    item_local->type = item_local->type | 0x100;
    item_local->prev = (cJSON *)0x0;
    item_local->next = (cJSON *)0x0;
  }
  return item_local;
}

Assistant:

static cJSON *create_reference(const cJSON *item, const internal_hooks * const hooks)
{
    cJSON *ref = cJSON_New_Item(hooks);
    if (!ref)
    {
        return NULL;
    }
    memcpy(ref, item, sizeof(cJSON));
    ref->string = NULL;
    ref->type |= cJSON_IsReference;
    ref->next = ref->prev = NULL;
    return ref;
}